

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_proxy.c
# Opt level: O3

CURLcode Curl_proxyCONNECT(connectdata *conn,int sockindex,char *hostname,int remote_port)

{
  undefined1 *puVar1;
  curl_off_t *pcVar2;
  long lVar3;
  http_connect_state *phVar4;
  uint uVar5;
  curl_socket_t *pcVar6;
  _Bool _Var7;
  byte bVar8;
  anon_enum_32 aVar9;
  CURLcode CVar10;
  int iVar11;
  CHUNKcode CVar12;
  char *pcVar13;
  char *pcVar14;
  char *pcVar15;
  timediff_t tVar16;
  size_t size;
  ulong uVar17;
  http_connect_state *phVar18;
  char *pcVar19;
  Curl_easy *data;
  char *pcVar20;
  char *pcVar21;
  curl_socket_t sockfd;
  bool bVar22;
  char byte;
  int local_a8;
  curl_socket_t local_a4;
  Curl_easy *local_a0;
  int *local_98;
  uint local_90;
  int subversion;
  curl_socket_t *local_88;
  curl_off_t *local_80;
  char *local_78;
  ssize_t tookcareof;
  char *local_68;
  curl_off_t *local_60;
  CURLcode extra;
  dynbuf req;
  
  phVar18 = conn->connect_state;
  local_90 = remote_port;
  local_78 = hostname;
  if (phVar18 == (http_connect_state *)0x0) {
    phVar18 = (http_connect_state *)(*Curl_ccalloc)(1,0x38);
    if (phVar18 == (http_connect_state *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
    Curl_infof(conn->data,"allocate connect buffer!\n");
    conn->connect_state = phVar18;
    Curl_dyn_init((dynbuf *)phVar18,0x4000);
    phVar18->tunnel_state = TUNNEL_INIT;
    phVar18->keepon = 1;
    phVar18->cl = 0;
    phVar18->field_0x34 = phVar18->field_0x34 & 0xfd;
    phVar18 = conn->connect_state;
    subversion = 0;
    if (phVar18 != (http_connect_state *)0x0) goto LAB_00127c64;
  }
  else {
LAB_00127c64:
    subversion = 0;
    local_88 = conn->sock + sockindex;
    if (phVar18->tunnel_state != TUNNEL_COMPLETE) {
      data = conn->data;
      local_a4 = *local_88;
      puVar1 = &(conn->bits).field_0x4;
      *puVar1 = *puVar1 & 0xef;
      local_60 = &(data->info).request_size;
      local_98 = &(data->req).httpcode;
      local_80 = &phVar18->cl;
      local_a8 = sockindex;
      local_a0 = data;
      do {
        aVar9 = phVar18->tunnel_state;
        sockfd = local_a4;
        do {
          pcVar13 = local_78;
          uVar5 = local_90;
          if (aVar9 == TUNNEL_INIT) {
            Curl_infof(data,"Establish HTTP proxy tunnel to %s:%d\n",local_78,(ulong)local_90);
            (*Curl_cfree)((data->req).newurl);
            (data->req).newurl = (char *)0x0;
            pcVar13 = curl_maprintf("%s:%d",pcVar13,(ulong)uVar5);
            if (pcVar13 == (char *)0x0) {
LAB_00128736:
              CVar10 = CURLE_OUT_OF_MEMORY;
            }
            else {
              Curl_dyn_init(&req,0x20000);
              CVar10 = Curl_http_output_auth(conn,"CONNECT",pcVar13,true);
              (*Curl_cfree)(pcVar13);
              pcVar13 = local_78;
              if (CVar10 == CURLE_OK) {
                pcVar21 = "1.1";
                if ((conn->http_proxy).proxytype == CURLPROXY_HTTP_1_0) {
                  pcVar21 = "1.0";
                }
                if ((conn->host).name == local_78) {
                  bVar22 = (bool)(((conn->bits).field_0x5 & 0x10) >> 4);
                }
                else {
                  pcVar14 = strchr(local_78,0x3a);
                  bVar22 = pcVar14 != (char *)0x0;
                }
                pcVar19 = "";
                pcVar14 = "";
                if (bVar22 != false) {
                  pcVar14 = "[";
                  pcVar19 = "]";
                }
                pcVar13 = curl_maprintf("%s%s%s:%d",pcVar14,pcVar13,pcVar19,(ulong)local_90);
                CVar10 = CURLE_OUT_OF_MEMORY;
                if (pcVar13 != (char *)0x0) {
                  pcVar14 = Curl_checkProxyheaders(conn,"Host");
                  if (pcVar14 == (char *)0x0) {
                    pcVar14 = curl_maprintf("Host: %s\r\n",pcVar13);
                    if (pcVar14 == (char *)0x0) {
                      (*Curl_cfree)(pcVar13);
                      goto LAB_001285fb;
                    }
                  }
                  else {
                    pcVar14 = (char *)0x0;
                  }
                  local_68 = pcVar21;
                  pcVar21 = Curl_checkProxyheaders(conn,"Proxy-Connection");
                  pcVar19 = "";
                  if (pcVar21 == (char *)0x0) {
                    pcVar19 = "Proxy-Connection: Keep-Alive\r\n";
                  }
                  pcVar15 = Curl_checkProxyheaders(conn,"User-Agent");
                  pcVar21 = "";
                  if ((pcVar15 == (char *)0x0) &&
                     (pcVar21 = "", (local_a0->set).str[0x26] != (char *)0x0)) {
                    pcVar21 = (local_a0->state).aptr.uagent;
                  }
                  pcVar15 = pcVar14;
                  if (pcVar14 == (char *)0x0) {
                    pcVar15 = "";
                  }
                  pcVar20 = (local_a0->state).aptr.proxyuserpwd;
                  if (pcVar20 == (char *)0x0) {
                    pcVar20 = "";
                  }
                  CVar10 = Curl_dyn_addf(&req,"CONNECT %s HTTP/%s\r\n%s%s%s%s",pcVar13,local_68,
                                         pcVar15,pcVar20,pcVar21,pcVar19);
                  if (pcVar14 != (char *)0x0) {
                    (*Curl_cfree)(pcVar14);
                  }
                  (*Curl_cfree)(pcVar13);
                  sockindex = local_a8;
                  if (CVar10 == CURLE_OK) {
                    CVar10 = Curl_add_custom_headers(conn,true,&req);
                    if (((CVar10 == CURLE_OK) &&
                        (CVar10 = Curl_dyn_add(&req,"\r\n"), CVar10 == CURLE_OK)) &&
                       (CVar10 = Curl_buffer_send(&req,conn,local_60,0,sockindex),
                       CVar10 == CURLE_OK)) {
                      Curl_dyn_free(&req);
                      phVar18->tunnel_state = TUNNEL_CONNECT;
                      data = local_a0;
                      sockfd = local_a4;
                      goto LAB_00127f79;
                    }
                  }
                  Curl_failf(local_a0,"Failed sending CONNECT to proxy");
                }
              }
LAB_001285fb:
              Curl_dyn_free(&req);
            }
            goto LAB_0012873c;
          }
LAB_00127f79:
          tVar16 = Curl_timeleft(data,(curltime *)0x0,true);
          if (tVar16 < 1) {
            Curl_failf(data,"Proxy CONNECT aborted due to timeout");
            CVar10 = CURLE_OPERATION_TIMEDOUT;
            goto LAB_0012873c;
          }
          _Var7 = Curl_conn_data_pending(conn,sockindex);
          if (!_Var7) goto LAB_00127c7d;
LAB_00127fa4:
          do {
            while( true ) {
              if (phVar18->keepon == 0) goto LAB_00128477;
              CVar10 = Curl_read(conn,sockfd,&byte,1,(ssize_t *)&req);
              if (CVar10 == CURLE_AGAIN) goto LAB_00127c7d;
              iVar11 = Curl_pgrsUpdate(conn);
              if (iVar11 != 0) {
                CVar10 = CURLE_ABORTED_BY_CALLBACK;
                goto LAB_0012873c;
              }
              if (CVar10 != CURLE_OK) {
                phVar18->keepon = 0;
                goto LAB_00128477;
              }
              if ((long)req.bufr < 1) {
                if (((data->set).proxyauth == 0) || ((data->state).authproxy.avail == 0)) {
                  Curl_failf(data,"Proxy CONNECT aborted");
                  bVar22 = true;
                }
                else {
                  puVar1 = &(conn->bits).field_0x4;
                  *puVar1 = *puVar1 | 0x10;
                  bVar22 = false;
                  Curl_infof(data,"Proxy CONNECT connection closed\n");
                }
                phVar18->keepon = 0;
                goto LAB_00128479;
              }
              if (1 < phVar18->keepon) break;
              CVar10 = Curl_dyn_addn(&phVar18->rcvbuf,&byte,1);
              if (CVar10 != CURLE_OK) {
                Curl_failf(data,"CONNECT response too large!");
                goto LAB_001285da;
              }
              if (byte == '\n') {
                pcVar13 = Curl_dyn_ptr(&phVar18->rcvbuf);
                size = Curl_dyn_len(&phVar18->rcvbuf);
                uVar17 = *(ulong *)&(data->set).field_0x978;
                if (((uint)uVar17 >> 0x1e & 1) != 0) {
                  Curl_debug(data,CURLINFO_HEADER_IN,pcVar13,size);
                  uVar17 = *(ulong *)&(data->set).field_0x978;
                }
                if (((uVar17 >> 0x31 & 1) == 0) &&
                   (CVar10 = Curl_client_write(conn,(((uint)uVar17 >> 0x19 & 1) != 0) + 2,pcVar13,
                                               size), CVar10 != CURLE_OK)) goto LAB_0012873c;
                data = local_a0;
                sockfd = local_a4;
                pcVar2 = &(local_a0->info).header_size;
                *pcVar2 = *pcVar2 + size;
                if ((*pcVar13 == '\r') || (*pcVar13 == '\n')) {
                  if ((*local_98 == 0x197) && (((local_a0->state).field_0x600 & 0x20) == 0)) {
                    phVar18->keepon = 2;
                    if (phVar18->cl == 0) {
                      if ((phVar18->field_0x34 & 1) == 0) goto LAB_0012824a;
                      Curl_infof(local_a0,"Ignore chunked response-body\n");
                      puVar1 = &(data->req).field_0x560;
                      *puVar1 = *puVar1 | 8;
                      pcVar21 = pcVar13 + 1;
                      if (pcVar13[1] != '\n') {
                        pcVar21 = pcVar13;
                      }
                      CVar12 = Curl_httpchunk_read(conn,pcVar21 + 1,1,(ssize_t *)&req,
                                                   (CURLcode *)&tookcareof);
                      if (CVar12 == CHUNKE_STOP) {
                        Curl_infof(data,"chunk reading DONE\n");
                        phVar18->keepon = 0;
                        phVar18->tunnel_state = TUNNEL_COMPLETE;
                      }
                    }
                    else {
                      Curl_infof(local_a0,"Ignore %ld bytes of response-body\n");
                    }
                  }
                  else {
LAB_0012824a:
                    phVar18->keepon = 0;
                  }
                  sockindex = local_a8;
                  if (*local_80 == 0) goto LAB_00128266;
                }
                else {
                  iVar11 = curl_strnequal("WWW-Authenticate:",pcVar13,0x11);
                  sockfd = local_a4;
                  if ((iVar11 == 0) || (*local_98 != 0x191)) {
                    iVar11 = curl_strnequal("Proxy-authenticate:",pcVar13,0x13);
                    if ((iVar11 != 0) && (_Var7 = true, *local_98 == 0x197)) goto LAB_001281c1;
                    iVar11 = curl_strnequal("Content-Length:",pcVar13,0xf);
                    if (iVar11 == 0) {
                      _Var7 = Curl_compareheader(pcVar13,"Connection:","close");
                      if (_Var7) {
LAB_00128291:
                        phVar18->field_0x34 = phVar18->field_0x34 | 2;
                      }
                      else {
                        iVar11 = curl_strnequal("Transfer-Encoding:",pcVar13,0x12);
                        if (iVar11 == 0) {
                          _Var7 = Curl_compareheader(pcVar13,"Proxy-Connection:","close");
                          if (_Var7) goto LAB_00128291;
                          iVar11 = __isoc99_sscanf(pcVar13,"HTTP/1.%d %d",&subversion,local_98);
                          if (iVar11 == 2) {
                            (local_a0->info).httpproxycode = (local_a0->req).httpcode;
                          }
                        }
                        else {
                          if (*local_98 - 200U < 100) {
                            pcVar13 = "Ignoring Transfer-Encoding in CONNECT %03d response\n";
                            data = local_a0;
                            goto LAB_0012823a;
                          }
                          _Var7 = Curl_compareheader(pcVar13,"Transfer-Encoding:","chunked");
                          if (_Var7) {
                            Curl_infof(local_a0,"CONNECT responded chunked\n");
                            phVar18->field_0x34 = phVar18->field_0x34 | 1;
                            Curl_httpchunk_init(conn);
                          }
                        }
                      }
                    }
                    else if (*local_98 - 200U < 100) {
                      pcVar13 = "Ignoring Content-Length in CONNECT %03d response\n";
LAB_0012823a:
                      Curl_infof(data,pcVar13);
                    }
                    else {
                      curlx_strtoofft(pcVar13 + 0xf,(char **)0x0,10,local_80);
                    }
                  }
                  else {
                    _Var7 = false;
LAB_001281c1:
                    pcVar13 = Curl_copy_header_value(pcVar13);
                    if (pcVar13 == (char *)0x0) goto LAB_00128736;
                    CVar10 = Curl_http_input_auth(conn,_Var7,pcVar13);
                    (*Curl_cfree)(pcVar13);
                    sockfd = local_a4;
                    if (CVar10 != CURLE_OK) goto LAB_0012873c;
                  }
                  Curl_dyn_reset(&phVar18->rcvbuf);
                  data = local_a0;
                  sockindex = local_a8;
                }
              }
            }
            lVar3 = *local_80;
            if (lVar3 == 0) {
              tookcareof = 0;
              CVar12 = Curl_httpchunk_read(conn,&byte,1,&tookcareof,&extra);
              if (CVar12 == CHUNKE_STOP) {
                Curl_infof(data,"chunk reading DONE\n");
                phVar18->keepon = 0;
LAB_00128266:
                phVar18->tunnel_state = TUNNEL_COMPLETE;
              }
              goto LAB_00127fa4;
            }
            *local_80 = lVar3 + -1;
          } while (1 < lVar3);
          phVar18->keepon = 0;
          phVar18->tunnel_state = TUNNEL_COMPLETE;
LAB_00128477:
          bVar22 = false;
LAB_00128479:
          iVar11 = Curl_pgrsUpdate(conn);
          if ((bVar22) || (iVar11 != 0)) {
            CVar10 = CURLE_RECV_ERROR;
            if (iVar11 != 0) {
              CVar10 = CURLE_ABORTED_BY_CALLBACK;
            }
            goto LAB_0012873c;
          }
          if ((data->info).httpproxycode - 200U < 100) {
            bVar8 = phVar18->field_0x34;
          }
          else {
            CVar10 = Curl_http_auth_act(conn);
            if (CVar10 != CURLE_OK) goto LAB_0012873c;
            bVar8 = phVar18->field_0x34;
            data = local_a0;
            if (((conn->bits).field_0x4 & 0x20) != 0) {
              bVar8 = bVar8 | 2;
              phVar18->field_0x34 = bVar8;
            }
          }
          pcVar6 = local_88;
          pcVar13 = (data->req).newurl;
          if ((bVar8 & 2) != 0) {
            if (pcVar13 != (char *)0x0) {
              Curl_closesocket(conn,*local_88);
              *pcVar6 = -1;
            }
            goto LAB_00128660;
          }
          if (pcVar13 == (char *)0x0) goto LAB_00128660;
          aVar9 = phVar18->tunnel_state;
        } while (aVar9 != TUNNEL_COMPLETE);
        phVar4 = conn->connect_state;
        Curl_dyn_reset(&phVar4->rcvbuf);
        phVar4->tunnel_state = TUNNEL_INIT;
        phVar4->keepon = 1;
        phVar4->cl = 0;
        phVar4->field_0x34 = phVar4->field_0x34 & 0xfd;
      } while ((data->req).newurl != (char *)0x0);
LAB_00128660:
      if ((data->info).httpproxycode - 200U < 100) {
        phVar18->tunnel_state = TUNNEL_COMPLETE;
        (*Curl_cfree)((data->state).aptr.proxyuserpwd);
        (data->state).aptr.proxyuserpwd = (char *)0x0;
        (data->state).authproxy.field_0x18 = ((data->state).authproxy.field_0x18 & 0xfc) + 1;
        Curl_infof(data,"Proxy replied %d to CONNECT request\n",
                   (ulong)(uint)(data->info).httpproxycode);
        puVar1 = &(data->req).field_0x560;
        *puVar1 = *puVar1 & 0xf7;
        puVar1 = &(conn->bits).field_0x6;
        *puVar1 = *puVar1 & 0xfb;
        Curl_dyn_free(&phVar18->rcvbuf);
      }
      else {
        pcVar13 = (data->req).newurl;
        if (pcVar13 == (char *)0x0 || (phVar18->field_0x34 & 2) == 0) {
          (*Curl_cfree)(pcVar13);
          (data->req).newurl = (char *)0x0;
          Curl_conncontrol(conn,2);
          pcVar6 = local_88;
          Curl_closesocket(conn,*local_88);
          *pcVar6 = -1;
        }
        else {
          puVar1 = &(conn->bits).field_0x4;
          *puVar1 = *puVar1 | 0x10;
          Curl_infof(data,"Connect me again please\n");
          phVar4 = conn->connect_state;
          phVar4->tunnel_state = TUNNEL_COMPLETE;
          Curl_dyn_free(&phVar4->rcvbuf);
          Curl_infof(conn->data,"CONNECT phase completed!\n");
        }
        phVar18->tunnel_state = TUNNEL_INIT;
        if (((conn->bits).field_0x4 & 0x10) == 0) {
          Curl_dyn_free(&phVar18->rcvbuf);
          Curl_failf(data,"Received HTTP code %d from proxy after CONNECT",
                     (ulong)(uint)(data->req).httpcode);
LAB_001285da:
          CVar10 = CURLE_RECV_ERROR;
          goto LAB_0012873c;
        }
      }
    }
  }
LAB_00127c7d:
  CVar10 = CURLE_OK;
  if ((conn->connect_state != (http_connect_state *)0x0) &&
     (CVar10 = CURLE_OK, conn->connect_state->tunnel_state != TUNNEL_COMPLETE)) {
    return CURLE_OK;
  }
LAB_0012873c:
  phVar18 = conn->connect_state;
  phVar18->tunnel_state = TUNNEL_COMPLETE;
  Curl_dyn_free(&phVar18->rcvbuf);
  Curl_infof(conn->data,"CONNECT phase completed!\n");
  return CVar10;
}

Assistant:

CURLcode Curl_proxyCONNECT(struct connectdata *conn,
                           int sockindex,
                           const char *hostname,
                           int remote_port)
{
  CURLcode result;
  if(!conn->connect_state) {
    result = connect_init(conn, FALSE);
    if(result)
      return result;
  }
  result = CONNECT(conn, sockindex, hostname, remote_port);

  if(result || Curl_connect_complete(conn))
    connect_done(conn);

  return result;
}